

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O3

int __thiscall
cs_impl::any::holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_>::kill
          (holder<std::__cxx11::list<cs_impl::any,_std::allocator<cs_impl::any>_>_> *this,
          __pid_t __pid,int __sig)

{
  undefined8 *puVar1;
  int extraout_EAX;
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  
  (**(this->super_baseHolder)._vptr_baseHolder)
            (this,CONCAT44(in_register_00000034,__pid),CONCAT44(in_register_00000014,__sig));
  if ((DAT_00335be8 < 0x40) && (cs::global_thread_counter == 0)) {
    puVar1 = &holder<std::__cxx11::list<cs_impl::any,std::allocator<cs_impl::any>>>::allocator +
             DAT_00335be8;
    DAT_00335be8 = DAT_00335be8 + 1;
    *puVar1 = this;
    return 0x3359e0;
  }
  operator_delete(this,0x20);
  return extraout_EAX;
}

Assistant:

void kill() override
			{
				allocator.free(this);
			}